

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::MaxBipartiteMatchState::MaxBipartiteMatchState
          (MaxBipartiteMatchState *this,MatchMatrix *graph)

{
  value_type_conflict4 *__value;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  allocator_type *in_stack_ffffffffffffffa8;
  allocator_type *__a;
  value_type_conflict4 *in_stack_ffffffffffffffb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  
  *in_RDI = in_RSI;
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1);
  MatchMatrix::LhsSize((MatchMatrix *)*in_RDI);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x32d5e8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,(size_type)in_RDI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x32d60f);
  __a = (allocator_type *)(in_RDI + 4);
  __value = (value_type_conflict4 *)MatchMatrix::RhsSize((MatchMatrix *)*in_RDI);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x32d63e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,(size_type)in_RDI,__value,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x32d665);
  return;
}

Assistant:

explicit MaxBipartiteMatchState(const MatchMatrix& graph)
      : graph_(&graph),
        left_(graph_->LhsSize(), kUnused),
        right_(graph_->RhsSize(), kUnused) {
  }